

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::MakeLayer::MakeLayer(MakeLayer *this,Array *weights,Array *bias,Activation *af)

{
  valarray<float> *pvVar1;
  Activation *af_local;
  Array *bias_local;
  Array *weights_local;
  MakeLayer *this_local;
  
  this->nInputs = 0;
  this->nOutputs = 0;
  pvVar1 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar1,weights);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->maybeWeights,pvVar1);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar1,bias);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->maybeBias,pvVar1);
  this->maybeActivation = af;
  return;
}

Assistant:

MakeLayer(const Array &weights, const Array &bias, const Activation &af)
        : maybeWeights(std::shared_ptr<Array>(new Array(weights))),
          maybeBias(std::shared_ptr<Array>(new Array(bias))),
          maybeActivation(&af) {}